

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_includes(lyout *out,lys_include *inc,uint8_t inc_size,int *first)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int local_30;
  int local_2c;
  int f;
  int i;
  int *first_local;
  lys_include *plStack_18;
  uint8_t inc_size_local;
  lys_include *inc_local;
  lyout *out_local;
  
  if (inc_size != '\0') {
    bVar3 = false;
    if (first != (int *)0x0) {
      bVar3 = *first != 0;
    }
    pcVar1 = ",";
    if (bVar3) {
      pcVar1 = "";
    }
    _f = first;
    first_local._7_1_ = inc_size;
    plStack_18 = inc;
    inc_local = (lys_include *)out;
    ly_print(out,"%s\"include\":{",pcVar1);
    for (local_2c = 0; local_2c < (int)(uint)first_local._7_1_; local_2c = local_2c + 1) {
      pcVar1 = "";
      if (local_2c != 0) {
        pcVar1 = ",";
      }
      pcVar2 = "";
      if (plStack_18[local_2c].rev[0] != '\0') {
        pcVar2 = "@";
      }
      ly_print((lyout *)inc_local,"%s\"%s%s%s\":{",pcVar1,(plStack_18[local_2c].submodule)->name,
               pcVar2,plStack_18[local_2c].rev);
      local_30 = 1;
      jsons_print_text((lyout *)inc_local,"description","text",plStack_18[local_2c].dsc,1,&local_30)
      ;
      jsons_print_text((lyout *)inc_local,"reference","text",plStack_18[local_2c].ref,1,&local_30);
      ly_print((lyout *)inc_local,"}");
    }
    ly_print((lyout *)inc_local,"}");
    if (_f != (int *)0x0) {
      *_f = 0;
    }
  }
  return;
}

Assistant:

static void
jsons_print_includes(struct lyout *out, const struct lys_include *inc, uint8_t inc_size, int *first)
{
    int i, f;

    if (!inc_size) {
        return;
    }

    ly_print(out, "%s\"include\":{", (first && (*first)) ? "" : ",");
    for (i = 0; i < inc_size; ++i) {
        ly_print(out, "%s\"%s%s%s\":{", i ? "," : "", inc[i].submodule->name,
                 inc[i].rev[0] ? "@" : "", inc[i].rev);
        f = 1;
        jsons_print_text(out, "description", "text", inc[i].dsc, 1, &f);
        jsons_print_text(out, "reference", "text", inc[i].ref, 1, &f);
        ly_print(out, "}");
    }
    ly_print(out, "}");
    if (first) {
        (*first) = 0;
    }
}